

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O3

bool __thiscall tiger::trains::world::Train::upgrade(Train *this)

{
  int iVar1;
  ICommandSender *pIVar2;
  initializer_list<int> __l;
  allocator_type local_7d;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  UpgradeModel local_40;
  
  pIVar2 = World::getCommandSender(this->owner);
  local_7c = this->idx;
  __l._M_len = 1;
  __l._M_array = &local_7c;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,__l,&local_7d);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  models::UpgradeModel::UpgradeModel(&local_40,&local_58,&local_78);
  iVar1 = (*pIVar2->_vptr_ICommandSender[3])(pIVar2,&local_40);
  if (local_40.postIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.postIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.postIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.postIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_40.trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.trainIdxList.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.trainIdxList.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool Train::upgrade() const
{
    return (owner->getCommandSender()->upgrade(models::UpgradeModel({idx}, {})));
}